

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O0

void __thiscall
Utf8Decode_UnexpectedContinuationBytes_Test::TestBody
          (Utf8Decode_UnexpectedContinuationBytes_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  allocator<unsigned_char> local_1ad;
  uchar local_1ac [4];
  iterator local_1a8;
  size_type local_1a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_198;
  cpstring local_180;
  allocator<unsigned_char> local_15c;
  uchar local_15b [3];
  iterator local_158;
  size_type local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  cpstring local_130;
  allocator<unsigned_char> local_10b;
  uchar local_10a [2];
  iterator local_108;
  size_type local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  cpstring local_e0;
  allocator<unsigned_char> local_ba;
  uchar local_b9;
  iterator local_b8;
  size_type local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  cpstring local_90;
  allocator<unsigned_char> local_5a;
  uchar local_59;
  iterator local_58;
  size_type local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  cpstring local_30;
  Utf8Decode_UnexpectedContinuationBytes_Test *local_10;
  Utf8Decode_UnexpectedContinuationBytes_Test *this_local;
  
  local_59 = 0x80;
  local_58 = &local_59;
  local_50 = 1;
  local_10 = this;
  std::allocator<unsigned_char>::allocator(&local_5a);
  __l_03._M_len = local_50;
  __l_03._M_array = local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_48,__l_03,&local_5a);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_30,this,&local_48);
  std::__cxx11::u32string::~u32string((u32string *)&local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_48);
  std::allocator<unsigned_char>::~allocator(&local_5a);
  local_b9 = 0xbf;
  local_b8 = &local_b9;
  local_b0 = 1;
  std::allocator<unsigned_char>::allocator(&local_ba);
  __l_02._M_len = local_b0;
  __l_02._M_array = local_b8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_a8,__l_02,&local_ba);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_90,this,&local_a8);
  std::__cxx11::u32string::~u32string((u32string *)&local_90);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_a8);
  std::allocator<unsigned_char>::~allocator(&local_ba);
  local_10a[0] = 0x80;
  local_10a[1] = 0xbf;
  local_108 = local_10a;
  local_100 = 2;
  std::allocator<unsigned_char>::allocator(&local_10b);
  __l_01._M_len = local_100;
  __l_01._M_array = local_108;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_f8,__l_01,&local_10b);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_e0,this,&local_f8);
  std::__cxx11::u32string::~u32string((u32string *)&local_e0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_f8);
  std::allocator<unsigned_char>::~allocator(&local_10b);
  local_15b[0] = 0x80;
  local_15b[1] = 0xbf;
  local_15b[2] = 0x80;
  local_158 = local_15b;
  local_150 = 3;
  std::allocator<unsigned_char>::allocator(&local_15c);
  __l_00._M_len = local_150;
  __l_00._M_array = local_158;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_148,__l_00,&local_15c);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_130,this,&local_148);
  std::__cxx11::u32string::~u32string((u32string *)&local_130);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_148);
  std::allocator<unsigned_char>::~allocator(&local_15c);
  local_1ac[0] = 0x80;
  local_1ac[1] = 0xbf;
  local_1ac[2] = 0x80;
  local_1ac[3] = 0xbf;
  local_1a8 = local_1ac;
  local_1a0 = 4;
  std::allocator<unsigned_char>::allocator(&local_1ad);
  __l._M_len = local_1a0;
  __l._M_array = local_1a8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_198,__l,&local_1ad);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_180,this,&local_198);
  std::__cxx11::u32string::~u32string((u32string *)&local_180);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_198);
  std::allocator<unsigned_char>::~allocator(&local_1ad);
  return;
}

Assistant:

TEST_F (Utf8Decode, UnexpectedContinuationBytes) {
    decode_bad (bytes ({0x80}));                   // first continuation byte
    decode_bad (bytes ({0xbf}));                   // last continuation byte
    decode_bad (bytes ({0x80, 0xbf}));             // 2 continuation bytes
    decode_bad (bytes ({0x80, 0xbf, 0x80}));       // 3 continuation bytes
    decode_bad (bytes ({0x80, 0xbf, 0x80, 0xbf})); // 4 continuation bytes
}